

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O1

int __thiscall
DiskBuilder::LoadDisk
          (DiskBuilder *this,
          vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list,
          IDisk **created_disk,ILoadingProgress *loading_progress)

{
  FormatType *pFVar1;
  int iVar2;
  pointer ppFVar3;
  bool bVar4;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> local_48;
  
  ppFVar3 = (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar4 = ppFVar3 ==
          (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar4) {
    do {
      pFVar1 = *ppFVar3;
      std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::vector
                (&local_48,file_list);
      iVar2 = (*pFVar1->_vptr_FormatType[7])(pFVar1,&local_48,created_disk,loading_progress);
      std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&local_48)
      ;
      if (iVar2 == 0) break;
      ppFVar3 = ppFVar3 + 1;
      bVar4 = ppFVar3 ==
              (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar4);
  }
  return -(uint)bVar4;
}

Assistant:

int DiskBuilder::LoadDisk(std::vector<FormatType::TrackItem> file_list, IDisk*& created_disk,
                          ILoadingProgress* loading_progress)
{
   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      if ((*it)->LoadDisk(file_list, created_disk, loading_progress) == 0)
         return 0;;
   }
   return -1;
}